

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O1

void QUnicodeTools::Tailored::thaiAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  size_t allocSize_00;
  char16_t cVar1;
  QBasicAtomicInteger<signed_char> QVar2;
  int iVar3;
  size_t __size;
  ulong extraout_RAX;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  QCharAttributes *pQVar7;
  Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai> *this;
  char cVar8;
  size_t allocSize;
  undefined1 *puVar9;
  long in_FS_OFFSET;
  QVarLengthArray<int,_128LL> break_positions;
  QVarLengthArray<char,_129LL> s;
  undefined2 local_2f3;
  undefined1 local_2f1;
  long local_2f0;
  qsizetype local_2e8;
  undefined1 *local_2e0;
  undefined1 local_2d8 [512];
  size_t local_d8;
  size_t local_d0;
  undefined1 *local_c8;
  undefined1 local_c0 [136];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_d8,0xaa,0xa0);
  allocSize_00 = len + 1;
  local_d8 = 0x81;
  local_d0 = 0;
  local_c8 = local_c0;
  if (0x80 < len) {
    local_d8 = allocSize_00;
    __size = QtPrivate::expectedAllocSize(allocSize_00,0x10);
    if (__size == 0) {
      __size = allocSize_00;
    }
    local_c8 = (undefined1 *)malloc(__size);
    local_d8 = __size;
    if (local_c8 == (undefined1 *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
      goto LAB_00345f6b;
    }
  }
  local_d0 = allocSize_00;
  memset(&local_2f0,0xaa,0x218);
  local_2f0 = 0x80;
  local_2e8 = 0;
  local_2e0 = local_2d8;
  if ((len < 0x81) || (thaiAttributes(), (extraout_RAX & 1) == 0)) {
    QVar2._q_value.super___atomic_base<signed_char>._M_i =
         QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>::
         guard._q_value.super___atomic_base<signed_char>._M_i;
    local_2f3 = 0xaaaa;
    local_2f1 = 0xaa;
    local_2e8 = len;
    if ((char)QtGlobalStatic::
              Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>::guard.
              _q_value.super___atomic_base<signed_char>._M_i < -1) {
      puVar9 = (undefined1 *)0x0;
    }
    else {
      puVar9 = QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
               ::instance()::holder;
      if (QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
          ::instance()::holder == '\0') {
        this = (Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai> *)
               &QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                ::instance()::holder;
        iVar3 = __cxa_guard_acquire();
        if (iVar3 != 0) {
          QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>::
          Holder(this);
          puVar9 = QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                   ::instance()::holder;
          __cxa_atexit(QtGlobalStatic::
                       Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>::
                       ~Holder,QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                               ::instance()::holder,&__dso_handle);
          __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                               ::instance()::holder);
        }
      }
    }
    if ((((-2 < (char)QVar2._q_value.super___atomic_base<signed_char>._M_i) &&
         (*(long *)(puVar9 + 0x20) != 0)) && (*(long *)(puVar9 + 0x28) != 0)) &&
       (*(long *)(puVar9 + 0x18) != 0)) {
      pQVar7 = attributes + from;
      if (len < 1) {
        local_c8[len] = 0;
      }
      else {
        lVar5 = 0;
        do {
          cVar1 = text[from + lVar5];
          cVar8 = (char)cVar1 + -0x60;
          if (0x5a < (ushort)(cVar1 + L'\xf1ff')) {
            cVar8 = -1;
          }
          if ((ushort)cVar1 < 0xa1) {
            cVar8 = (char)cVar1;
          }
          local_c8[lVar5] = cVar8;
          lVar5 = lVar5 + 1;
        } while (len != lVar5);
        local_c8[len] = 0;
        if (0 < len) {
          lVar5 = 0;
          do {
            pQVar7[lVar5] = (QCharAttributes)((byte)pQVar7[lVar5] & 0x95);
            lVar5 = lVar5 + 1;
          } while (len != lVar5);
        }
      }
      *pQVar7 = (QCharAttributes)((byte)*pQVar7 & 0x9d | 0x22);
      iVar3 = (**(code **)(puVar9 + 0x20))
                        (*(undefined8 *)(puVar9 + 0x18),local_c8,local_2e0,local_2e8);
      if (0 < iVar3) {
        lVar5 = 0;
        do {
          pQVar7[*(int *)(local_2e0 + lVar5 * 4)] =
               (QCharAttributes)((byte)pQVar7[*(int *)(local_2e0 + lVar5 * 4)] | 2);
          pQVar7[*(int *)(local_2e0 + lVar5 * 4)] =
               (QCharAttributes)((byte)pQVar7[*(int *)(local_2e0 + lVar5 * 4)] | 0x20);
          pQVar7[*(int *)(local_2e0 + lVar5 * 4)] =
               (QCharAttributes)((byte)pQVar7[*(int *)(local_2e0 + lVar5 * 4)] | 0x40);
          pQVar7[*(int *)(local_2e0 + lVar5 * 4)] =
               (QCharAttributes)((byte)pQVar7[*(int *)(local_2e0 + lVar5 * 4)] | 8);
          lVar5 = lVar5 + 1;
        } while (iVar3 != lVar5);
        if (0 < iVar3) {
          pQVar7[*(int *)(local_2e0 + (long)iVar3 * 4 + -4)] =
               (QCharAttributes)((byte)pQVar7[*(int *)(local_2e0 + (long)iVar3 * 4 + -4)] & 0xdf);
        }
      }
      if (0 < len) {
        lVar5 = 0;
        do {
          uVar4 = (**(code **)(puVar9 + 0x28))(local_c8 + lVar5,len - lVar5,&local_2f3,1);
          pQVar7[lVar5] = (QCharAttributes)((byte)pQVar7[lVar5] | 1);
          if (1 < uVar4) {
            uVar6 = 1;
            do {
              pQVar7[uVar6 + lVar5] = (QCharAttributes)((byte)pQVar7[uVar6 + lVar5] & 0xfe);
              uVar6 = uVar6 + 1;
            } while (uVar4 != uVar6);
          }
          lVar5 = lVar5 + uVar4;
        } while (lVar5 < len);
      }
    }
    if (local_2e0 != local_2d8) {
      QtPrivate::sizedFree(local_2e0,local_2f0 << 2);
    }
    if (local_c8 != local_c0) {
      QtPrivate::sizedFree(local_c8,local_d8);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    qBadAlloc();
  }
LAB_00345f6b:
  __stack_chk_fail();
}

Assistant:

static void thaiAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    assert(script == QChar::Script_Thai);
#if QT_CONFIG(library)
    const char16_t *uc = text + from;
    attributes += from;
    Q_UNUSED(script);
    thaiAssignAttributes(uc, len, attributes);
#else
    Q_UNUSED(script);
    Q_UNUSED(text);
    Q_UNUSED(from);
    Q_UNUSED(len);
    Q_UNUSED(attributes);
#endif
}